

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

bool __thiscall QAction::event(QAction *this,QEvent *e)

{
  long lVar1;
  long lVar2;
  undefined1 uVar3;
  short sVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char> local_68;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  sVar4 = *(short *)(e + 8);
  if (sVar4 == 0x71) {
    lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x148);
    lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x150);
    for (lVar5 = 0; lVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
      QCoreApplication::sendEvent(*(QObject **)(lVar1 + lVar5),(QEvent *)e);
    }
    sVar4 = *(short *)(e + 8);
  }
  if (sVar4 == 0x75) {
    if (e[0x1c] == (QEvent)0x1) {
      local_50[0] = '\x02';
      local_50[1] = '\0';
      local_50[2] = '\0';
      local_50[3] = '\0';
      local_50[0x14] = '\0';
      local_50[0x15] = '\0';
      local_50[0x16] = '\0';
      local_50[0x17] = '\0';
      local_50[4] = '\0';
      local_50[5] = '\0';
      local_50[6] = '\0';
      local_50[7] = '\0';
      local_50[8] = '\0';
      local_50[9] = '\0';
      local_50[10] = '\0';
      local_50[0xb] = '\0';
      local_50[0xc] = '\0';
      local_50[0xd] = '\0';
      local_50[0xe] = '\0';
      local_50[0xf] = '\0';
      local_50[0x10] = '\0';
      local_50[0x11] = '\0';
      local_50[0x12] = '\0';
      local_50[0x13] = '\0';
      local_38 = "default";
      QKeySequence::toString((QString *)&local_80,(QKeySequence *)(e + 0x10),NativeText);
      QString::toLatin1_helper_inplace((QString *)&local_68);
      if (local_68.ptr == (char *)0x0) {
        local_68.ptr = (char *)&QByteArray::_empty;
      }
      QMessageLogger::warning
                (local_50,"QAction::event: Ambiguous shortcut overload: %s",local_68.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    }
    else {
      activate(this,Trigger);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return true;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    uVar3 = QObject::event((QEvent *)this);
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QAction::event(QEvent *e)
{
    Q_D(QAction);
    if (e->type() == QEvent::ActionChanged) {
        for (auto object : std::as_const(d->associatedObjects))
            QCoreApplication::sendEvent(object, e);
    }

#if QT_CONFIG(shortcut)
    if (e->type() == QEvent::Shortcut) {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        Q_ASSERT_X(d_func()->shortcutIds.contains(se->shortcutId()),
                   "QAction::event",
                   "Received shortcut event from incorrect shortcut");
        if (se->isAmbiguous())
            qWarning("QAction::event: Ambiguous shortcut overload: %s", se->key().toString(QKeySequence::NativeText).toLatin1().constData());
        else
            activate(Trigger);
        return true;
    }
#endif // QT_CONFIG(shortcut)
    return QObject::event(e);
}